

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::HighBDConvolveScaleTest_Check_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::HighBDConvolveScaleTest_Check_Test> *this
          )

{
  Test *this_00;
  
  WithParamInterface<std::tuple<void(*)(unsigned_short_const*,int,unsigned_short*,int,int,int,InterpFilterParams_const*,InterpFilterParams_const*,int,int,int,int,ConvolveParams*,int),std::tuple<int,int>,int>>
  ::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x80);
  Test::Test(this_00);
  this_00[3].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  this_00->_vptr_Test = (_func_int **)&PTR__HighBDConvolveScaleTest_010c87d0;
  this_00[7]._vptr_Test = (_func_int **)&PTR__HighBDConvolveScaleTest_Check_Test_010c8818;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }